

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

Int ipx::FindMaxAbs(Vector *x)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  double dVar5;
  
  dVar5 = 0.0;
  sVar3 = 0;
  for (sVar4 = 0; x->_M_size != sVar4; sVar4 = sVar4 + 1) {
    dVar1 = ABS(x->_M_data[sVar4]);
    sVar2 = sVar4;
    if (ABS(x->_M_data[sVar4]) <= dVar5) {
      dVar1 = dVar5;
      sVar2 = sVar3;
    }
    sVar3 = sVar2;
    dVar5 = dVar1;
  }
  return (Int)sVar3;
}

Assistant:

Int FindMaxAbs(const Vector& x) {
    double xmax = 0.0;
    size_t imax = 0;
    for (size_t i = 0; i < x.size(); i++) {
        if (std::abs(x[i]) > xmax) {
            xmax = std::abs(x[i]);
            imax = i;
        }
    }
    return static_cast<Int>(imax);
}